

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O3

void __thiscall RegressionTree::loadFeatures(RegressionTree *this)

{
  _WordT *p_Var1;
  proto_child0 peVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  size_t *__s;
  istream *piVar7;
  int *piVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  long *plVar12;
  undefined8 *puVar13;
  long *plVar14;
  ulong uVar15;
  ulong extraout_RDX;
  ulong uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int numOfFeatures;
  string line;
  int degreeOfInteractions;
  string attrName;
  string rootName;
  string typeOfFeature;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  string typeOfLabel;
  string labelName;
  stringstream ssLine;
  ifstream input;
  int local_4d0;
  int local_4cc;
  char *local_4c8;
  long local_4c0;
  char local_4b8 [20];
  undefined4 local_4a4;
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  string local_480;
  string local_460;
  long *local_440;
  undefined8 local_438;
  undefined1 local_430 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_400;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  local_3f0;
  string local_3e0;
  undefined1 local_3c0 [128];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  __s = (size_t *)operator_new__(800);
  memset(__s,0,800);
  this->_queryRootIndex = __s;
  std::ifstream::ifstream
            ((istream *)local_238,(string *)multifaq::config::FEATURE_CONF_abi_cxx11_,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   multifaq::config::FEATURE_CONF_abi_cxx11_," does not exist. \n");
    std::operator<<((ostream *)&std::cerr,(string *)local_3c0);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
LAB_00153bdd:
    std::__cxx11::string::~string((string *)this_00);
    goto LAB_00153be2;
  }
  local_4c8 = local_4b8;
  local_4c0 = 0;
  local_4b8[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  local_4cc = 0;
  local_4a4 = 0;
  do {
    do {
      cVar4 = (char)(istream *)local_238;
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar4);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_4c8,cVar3);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_0015346b;
    } while (*local_4c8 == '#');
    iVar6 = std::__cxx11::string::compare((char *)&local_4c8);
  } while (iVar6 == 0);
LAB_0015346b:
  local_440 = (long *)&local_4cc;
  local_480._M_string_length = (size_type)&local_440;
  local_400.child0 = (proto_child0)&local_480;
  local_480._M_dataplus._M_p = &boost::spirit::int_;
  local_3e0._M_dataplus._M_p = (pointer)&local_400;
  local_400.child1.child0 = ",";
  local_4a0 = (long *)&local_4a4;
  local_460._M_string_length = (size_type)&local_4a0;
  local_3e0._M_string_length = (size_type)&local_460;
  local_460._M_dataplus._M_p = &boost::spirit::int_;
  local_420._M_dataplus._M_p = local_4c8;
  boost::spirit::qi::detail::
  phrase_parse_impl<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,2l>,void>
  ::
  call<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_420,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_4c8 + local_4c0),
             (expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
              *)&local_3e0,
             (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>
              *)&boost::spirit::ascii::space,postskip);
  do {
    do {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar4);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_4c8,cVar3);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_0015354d;
    } while (*local_4c8 == '#');
    iVar6 = std::__cxx11::string::compare((char *)&local_4c8);
  } while (iVar6 == 0);
LAB_0015354d:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_3c0 + 0x10),local_4c8,local_4c0);
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  local_3e0._M_string_length = 0;
  local_3e0.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3c0,(string *)&local_3e0,':');
  local_400.child0 = &local_3f0;
  local_400.child1.child0 = (proto_child0)0x0;
  local_3f0.child0._0_1_ = 0;
  cVar4 = std::ios::widen((char)(istream *)local_3c0 +
                          (char)*(undefined8 *)(local_3c0._0_8_ + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3c0,(string *)&local_400,cVar4);
  peVar2 = local_400.child0;
  bVar5 = this->_classification;
  if ((bool)bVar5 == false) {
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    lVar9 = strtol((char *)peVar2,(char **)&local_480,10);
    if ((proto_child0)local_480._M_dataplus._M_p == peVar2) {
      std::__throw_invalid_argument("stoi");
LAB_00153bf8:
      std::__throw_out_of_range("stoi");
      goto LAB_00153c04;
    }
    if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_00153bf8;
    if (*piVar8 == 0) {
      *piVar8 = iVar6;
    }
    if ((int)lVar9 == 0) {
      bVar5 = this->_classification;
      goto LAB_00153662;
    }
  }
  else {
LAB_00153662:
    peVar2 = local_400.child0;
    if ((bVar5 & 1) == 0) {
LAB_001536db:
      sVar10 = TreeDecomposition::getAttributeIndex
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &local_3e0);
      this->_labelID = (int)sVar10;
      std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + (int)local_3c0);
      if (1 < local_4cc) {
        local_4d0 = 1;
        do {
          cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                  (char)(istream *)local_238);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_238,(string *)&local_4c8,cVar4);
          if (*local_4c8 != '#') {
            iVar6 = std::__cxx11::string::compare((char *)&local_4c8);
            if (iVar6 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_3c0 + 0x10),local_4c8,local_4c0);
              local_480._M_string_length = 0;
              local_480.field_2._M_local_buf[0] = '\0';
              local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_3c0,(string *)&local_480,':');
              local_438 = 0;
              local_430[0] = 0;
              local_440 = (long *)local_430;
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_3c0,(string *)&local_440,':');
              local_460._M_string_length = 0;
              local_460.field_2._M_local_buf[0] = '\0';
              local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
              cVar4 = std::ios::widen((char)*(undefined8 *)(local_3c0._0_8_ + -0x18) +
                                      (char)(istream *)local_3c0);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_3c0,(string *)&local_460,cVar4);
              sVar10 = TreeDecomposition::getAttributeIndex
                                 ((this->_td).
                                  super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,&local_480);
              plVar12 = local_440;
              piVar8 = __errno_location();
              iVar6 = *piVar8;
              *piVar8 = 0;
              lVar9 = strtol((char *)plVar12,(char **)&local_4a0,10);
              if (local_4a0 != plVar12) {
                if ((0xfffffffeffffffff < lVar9 - 0x80000000U) && (*piVar8 != 0x22)) {
                  if (*piVar8 == 0) {
                    *piVar8 = iVar6;
                  }
                  sVar11 = TreeDecomposition::getRelationIndex
                                     ((this->_td).
                                      super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,&local_460);
                  if ((int)sVar10 == -1) {
                    std::operator+(&local_420,"Attribute |",&local_480);
                    plVar12 = (long *)std::__cxx11::string::append((char *)&local_420);
                    local_4a0 = (long *)*plVar12;
                    plVar14 = plVar12 + 2;
                    if (local_4a0 == plVar14) {
                      local_490 = *plVar14;
                      lStack_488 = plVar12[3];
                      local_4a0 = &local_490;
                    }
                    else {
                      local_490 = *plVar14;
                    }
                    local_498 = plVar12[1];
                    *plVar12 = (long)plVar14;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    std::operator<<((ostream *)&std::cerr,(string *)&local_4a0);
                  }
                  else {
                    if (local_4d0 == 0 && (int)lVar9 != 0) {
                      std::operator<<((ostream *)&std::cerr,"The label needs to be continuous! ");
                      goto LAB_00153be2;
                    }
                    if ((int)sVar11 != -1) {
                      uVar15 = (ulong)(int)sVar10;
                      if (99 < uVar15) goto LAB_00153abe;
                      uVar16 = 1L << ((byte)sVar10 & 0x3f);
                      p_Var1 = (this->_features).super__Base_bitset<2UL>._M_w + (uVar15 >> 6);
                      *p_Var1 = *p_Var1 | uVar16;
                      if ((int)lVar9 != 0) {
                        p_Var1 = (this->_categoricalFeatures).super__Base_bitset<2UL>._M_w +
                                 (uVar15 >> 6);
                        *p_Var1 = *p_Var1 | uVar16;
                      }
                      this->_queryRootIndex[uVar15] = (long)(int)sVar11;
                      std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + (int)local_3c0
                                     );
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_460._M_dataplus._M_p != &local_460.field_2) {
                        operator_delete(local_460._M_dataplus._M_p);
                      }
                      if (local_440 != (long *)local_430) {
                        operator_delete(local_440);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_480._M_dataplus._M_p != &local_480.field_2) {
                        operator_delete(local_480._M_dataplus._M_p);
                      }
                      local_4d0 = local_4d0 + 1;
                      goto LAB_001539a3;
                    }
                    std::operator+(&local_420,"Relation |",&local_460);
                    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_420);
                    local_4a0 = (long *)*puVar13;
                    plVar12 = puVar13 + 2;
                    if (local_4a0 == plVar12) {
                      local_490 = *plVar12;
                      lStack_488 = puVar13[3];
                      local_4a0 = &local_490;
                    }
                    else {
                      local_490 = *plVar12;
                    }
                    local_498 = puVar13[1];
                    *puVar13 = plVar12;
                    puVar13[1] = 0;
                    *(undefined1 *)(puVar13 + 2) = 0;
                    std::operator<<((ostream *)&std::cerr,(string *)&local_4a0);
                  }
                  std::__cxx11::string::~string((string *)&local_4a0);
                  this_00 = &local_420;
                  goto LAB_00153bdd;
                }
                std::__throw_out_of_range("stoi");
              }
              std::__throw_invalid_argument("stoi");
              uVar15 = extraout_RDX;
LAB_00153abe:
              std::__throw_out_of_range_fmt
                        ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar15,
                         100);
            }
          }
LAB_001539a3:
        } while (local_4d0 < local_4cc);
      }
      if (local_400.child0 != &local_3f0) {
        operator_delete(local_400.child0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
        operator_delete(local_3e0._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
      std::ios_base::~ios_base(local_340);
      if (local_4c8 != local_4b8) {
        operator_delete(local_4c8);
      }
      std::ifstream::~ifstream(local_238);
      return;
    }
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    lVar9 = strtol((char *)peVar2,(char **)&local_480,10);
    if ((proto_child0)local_480._M_dataplus._M_p != peVar2) {
      if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) {
        std::__throw_out_of_range("stoi");
      }
      else {
        if (*piVar8 == 0) {
          *piVar8 = iVar6;
        }
        if ((int)lVar9 == 1) goto LAB_001536db;
      }
      std::operator<<((ostream *)&std::cerr,"The label needs to be categorical! ");
      goto LAB_00153be2;
    }
LAB_00153c04:
    std::__throw_invalid_argument("stoi");
  }
  std::operator<<((ostream *)&std::cerr,"The label needs to be continuous! ");
LAB_00153be2:
  exit(1);
}

Assistant:

void RegressionTree::loadFeatures()
{
    _queryRootIndex = new size_t[NUM_OF_VARIABLES]();

    /* Load the two-pass variables config file into an input stream. */
    ifstream input(FEATURE_CONF);

    if (!input)
    {
        ERROR(FEATURE_CONF+" does not exist. \n");
        exit(1);
    }

    /* String and associated stream to receive lines from the file. */
    string line;
    stringstream ssLine;

    int numOfFeatures = 0;
    int degreeOfInteractions = 0;
    
    /* Ignore comment and empty lines at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;
        break;
    }
    
    /* 
     * Extract number of labels, features and interactions from the config. 
     * Parse the line with the three numbers; ignore spaces. 
     */
    bool parsingSuccess =
        qi::phrase_parse(line.begin(), line.end(),

                         /* Begin Boost Spirit grammar. */
                         ((qi::int_[phoenix::ref(numOfFeatures) = qi::_1])
                          >> NUMBER_SEPARATOR_CHAR
                          >> (qi::int_[phoenix::ref(degreeOfInteractions) =
                                       qi::_1])),
                         /*  End grammar. */
                          ascii::space);

    assert(parsingSuccess && "The parsing of the features file has failed.");

    
    /* Ignore comment and empty lines at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;

        break;
    }
    
    ssLine << line;


    string labelName;
    /* Extract the name of the attribute in the current line. */
    getline(ssLine, labelName, ATTRIBUTE_NAME_CHAR);

    string typeOfLabel;
    /* Extract the dimension of the current attribute. */
    getline(ssLine, typeOfLabel);

    if (!_classification && stoi(typeOfLabel) != 0)
    {
        ERROR("The label needs to be continuous! ");
        exit(1);
    }
    else if (_classification && stoi(typeOfLabel) != 1)
    {
        ERROR("The label needs to be categorical! ");
        exit(1);
    }
        

    _labelID = _td->getAttributeIndex(labelName);

    /* Clear string stream. */
    ssLine.clear();
    
    /* Read in the features. */
    for (int featureNo = 1; featureNo < numOfFeatures; ++featureNo)
    {
        getline(input, line);
        if (line[0] == COMMENT_CHAR || line == "")
        {
            --featureNo;
            continue;
        }

        ssLine << line;
        
        string attrName;
        /* Extract the name of the attribute in the current line. */
        getline(ssLine, attrName, ATTRIBUTE_NAME_CHAR);

        string typeOfFeature;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, typeOfFeature, ATTRIBUTE_NAME_CHAR);

        string rootName;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, rootName);
        
        int attributeID = _td->getAttributeIndex(attrName);
        bool categorical = stoi(typeOfFeature);
        int rootID = _td->getRelationIndex(rootName);

        if (attributeID == -1)
        {
            ERROR("Attribute |"+attrName+"| does not exist.");
            exit(1);
        }

        if (featureNo == 0 && categorical == 1)
        {
            ERROR("The label needs to be continuous! ");
            exit(1);
        }

        if (rootID == -1)
        {
            ERROR("Relation |"+rootName+"| does not exist.");
            exit(1);
        }

        _features.set(attributeID);

        if (categorical)
            _categoricalFeatures.set(attributeID);

        _queryRootIndex[attributeID] = rootID;
        
        /* Clear string stream. */
        ssLine.clear();
    }

    // cout << _features << "\n";
    // cout << _categoricalFeatures << "\n";
}